

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall ChatServer::incomingData(ChatServer *this,Stream *stream)

{
  bool bVar1;
  ostream *poVar2;
  reference ppSVar3;
  _Self local_a0;
  _Self local_98;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  mapped_type *local_40;
  string *nick;
  string line;
  Stream *stream_local;
  ChatServer *this_local;
  
  line.field_2._8_8_ = stream;
  readLine_abi_cxx11_((string *)&nick,stream);
  local_40 = std::
             map<Dashel::Stream_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->nicks,(key_type *)((long)&line.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,local_40,
                 " : ");
  std::operator+(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nick);
  std::__cxx11::string::operator=((string *)&nick,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&it);
  poVar2 = std::operator<<((ostream *)&std::cout,"* Message from ");
  std::operator<<(poVar2,(string *)&nick);
  local_98._M_node =
       (_Base_ptr)
       std::set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>::
       begin((set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>
              *)&this->field_0x48);
  while( true ) {
    local_a0._M_node =
         (_Base_ptr)
         std::set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>
         ::end((set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>
                *)&this->field_0x48);
    bVar1 = std::operator!=(&local_98,&local_a0);
    if (!bVar1) break;
    ppSVar3 = std::_Rb_tree_const_iterator<Dashel::Stream_*>::operator*(&local_98);
    sendString(*ppSVar3,(string *)&nick);
    std::_Rb_tree_const_iterator<Dashel::Stream_*>::operator++(&local_98);
  }
  std::__cxx11::string::~string((string *)&nick);
  return;
}

Assistant:

void incomingData(Stream* stream)
	{
		string line = readLine(stream);
		const string& nick = nicks[stream];
		line = nick + " : " + line;
		cout << "* Message from " << line;

		for (StreamsSet::iterator it = dataStreams.begin(); it != dataStreams.end(); ++it)
			sendString((*it), line);
	}